

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::PoolingParameter::MergePartialFromCodedStream(PoolingParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  uint8 uVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  undefined8 in_RAX;
  byte *pbVar7;
  long lVar8;
  int iVar9;
  UnknownFieldSet *pUVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  pair<unsigned_long,_bool> pVar14;
  undefined8 local_38;
  
  this_00 = &this->_internal_metadata_;
  local_38 = in_RAX;
  do {
    pbVar7 = input->buffer_;
    uVar6 = 0;
    if (pbVar7 < input->buffer_end_) {
      bVar1 = *pbVar7;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b0ed4;
      input->buffer_ = pbVar7 + 1;
      uVar13 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b0ed4:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar13 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar6 | uVar13;
    }
    uVar12 = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto switchD_003b0f28_default;
    cVar11 = (char)uVar13;
    switch((uint)(uVar13 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar11 != '\b') break;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar13 = (ulong)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003b1235;
        input->buffer_ = pbVar7 + 1;
        bVar5 = true;
      }
      else {
        uVar6 = 0;
LAB_003b1235:
        uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        bVar5 = -1 < (long)uVar13;
      }
      iVar9 = 6;
      if (bVar5) {
        local_38._4_4_ = (uint)uVar13;
      }
      if (bVar5) {
        if (local_38._4_4_ < 3) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          this->pool_ = local_38._4_4_;
        }
        else {
          pvVar3 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar3 & 1) == 0) {
            pUVar10 = google::protobuf::internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            pUVar10 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
          }
          iVar9 = 1;
          uVar12 = local_38._4_4_;
LAB_003b1305:
          google::protobuf::UnknownFieldSet::AddVarint(pUVar10,iVar9,(long)(int)uVar12);
        }
LAB_003b130b:
        iVar9 = 0;
      }
LAB_003b130d:
      if (bVar5) goto LAB_003b132a;
      goto LAB_003b132c;
    case 2:
      if (cVar11 != '\x10') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar6 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->kernel_size_ = (uint)bVar1;
LAB_003b1198:
          input->buffer_ = pbVar7 + 1;
          goto LAB_003b132a;
        }
      }
      else {
        uVar6 = 0;
      }
      lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
      this->kernel_size_ = (uint32)lVar8;
LAB_003b1322:
      iVar9 = 6;
      if (lVar8 < 0) goto LAB_003b132c;
      goto LAB_003b132a;
    case 3:
      if (cVar11 == '\x18') {
        pbVar7 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar7 = *pbVar7 | 8;
        pbVar7 = input->buffer_;
        if (pbVar7 < input->buffer_end_) {
          bVar1 = *pbVar7;
          uVar6 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->stride_ = (uint)bVar1;
            goto LAB_003b1198;
          }
        }
        else {
          uVar6 = 0;
        }
        lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        this->stride_ = (uint32)lVar8;
        goto LAB_003b1322;
      }
      break;
    case 4:
      if (cVar11 == ' ') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pbVar7 = input->buffer_;
        if (pbVar7 < input->buffer_end_) {
          bVar1 = *pbVar7;
          uVar6 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->pad_ = (uint)bVar1;
            goto LAB_003b1198;
          }
        }
        else {
          uVar6 = 0;
        }
        lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        this->pad_ = (uint32)lVar8;
        goto LAB_003b1322;
      }
      break;
    case 5:
      if (cVar11 == '(') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        pbVar7 = input->buffer_;
        if (pbVar7 < input->buffer_end_) {
          bVar1 = *pbVar7;
          uVar6 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->kernel_h_ = (uint)bVar1;
            goto LAB_003b1198;
          }
        }
        else {
          uVar6 = 0;
        }
        lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        this->kernel_h_ = (uint32)lVar8;
        goto LAB_003b1322;
      }
      break;
    case 6:
      if (cVar11 == '0') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        pbVar7 = input->buffer_;
        if (pbVar7 < input->buffer_end_) {
          bVar1 = *pbVar7;
          uVar6 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->kernel_w_ = (uint)bVar1;
            goto LAB_003b1198;
          }
        }
        else {
          uVar6 = 0;
        }
        lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        this->kernel_w_ = (uint32)lVar8;
        goto LAB_003b1322;
      }
      break;
    case 7:
      if (cVar11 == '8') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
        pbVar7 = input->buffer_;
        if (pbVar7 < input->buffer_end_) {
          bVar1 = *pbVar7;
          uVar6 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->stride_h_ = (uint)bVar1;
            goto LAB_003b1198;
          }
        }
        else {
          uVar6 = 0;
        }
        lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        this->stride_h_ = (uint32)lVar8;
        goto LAB_003b1322;
      }
      break;
    case 8:
      if (cVar11 == '@') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
        pbVar7 = input->buffer_;
        if (pbVar7 < input->buffer_end_) {
          bVar1 = *pbVar7;
          uVar6 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->stride_w_ = (uint)bVar1;
            goto LAB_003b1198;
          }
        }
        else {
          uVar6 = 0;
        }
        lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        this->stride_w_ = (uint32)lVar8;
        goto LAB_003b1322;
      }
      break;
    case 9:
      if (cVar11 == 'H') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
        pbVar7 = input->buffer_;
        if (pbVar7 < input->buffer_end_) {
          bVar1 = *pbVar7;
          uVar6 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->pad_h_ = (uint)bVar1;
            goto LAB_003b1198;
          }
        }
        else {
          uVar6 = 0;
        }
        lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        this->pad_h_ = (uint32)lVar8;
        goto LAB_003b1322;
      }
      break;
    case 10:
      if (cVar11 == 'P') {
        pbVar7 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar7 = *pbVar7 | 1;
        pbVar7 = input->buffer_;
        if (pbVar7 < input->buffer_end_) {
          bVar1 = *pbVar7;
          uVar6 = (uint32)bVar1;
          if (-1 < (char)bVar1) {
            this->pad_w_ = (uint)bVar1;
            goto LAB_003b1198;
          }
        }
        else {
          uVar6 = 0;
        }
        lVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        this->pad_w_ = (uint32)lVar8;
        goto LAB_003b1322;
      }
      break;
    case 0xb:
      if (cVar11 == 'X') {
        pbVar7 = input->buffer_;
        if (pbVar7 < input->buffer_end_) {
          bVar1 = *pbVar7;
          uVar13 = (ulong)bVar1;
          uVar6 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003b12bf;
          input->buffer_ = pbVar7 + 1;
          bVar5 = true;
        }
        else {
          uVar6 = 0;
LAB_003b12bf:
          uVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
          bVar5 = -1 < (long)uVar13;
        }
        iVar9 = 6;
        if (bVar5) {
          local_38._0_4_ = (uint)uVar13;
        }
        if (bVar5) {
          if (2 < (uint)local_38) {
            pvVar3 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar3 & 1) == 0) {
              pUVar10 = google::protobuf::internal::
                        InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        ::mutable_unknown_fields_slow
                                  (&this_00->
                                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                  );
            }
            else {
              pUVar10 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
            }
            iVar9 = 0xb;
            uVar12 = (uint)local_38;
            goto LAB_003b1305;
          }
          pbVar7 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
          *pbVar7 = *pbVar7 | 2;
          this->engine_ = (uint)local_38;
          goto LAB_003b130b;
        }
        goto LAB_003b130d;
      }
      break;
    case 0xc:
      if (cVar11 == '`') {
        pbVar7 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
        *pbVar7 = *pbVar7 | 4;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar14._8_8_ = 1;
          pVar14.first = (long)(char)uVar2;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->global_pooling_ = pVar14.first != 0;
          goto LAB_003b132a;
        }
        iVar9 = 6;
        goto LAB_003b132c;
      }
    }
switchD_003b0f28_default:
    if ((uVar12 & 7) == 4 || uVar12 == 0) {
      iVar9 = 7;
    }
    else {
      pvVar3 = (this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_;
      if (((ulong)pvVar3 & 1) == 0) {
        pUVar10 = google::protobuf::internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            (&this_00->
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            );
      }
      else {
        pUVar10 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
      }
      bVar5 = google::protobuf::internal::WireFormat::SkipField(input,uVar12,pUVar10);
      iVar9 = 6;
      if (bVar5) {
LAB_003b132a:
        iVar9 = 0;
      }
    }
LAB_003b132c:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool PoolingParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.PoolingParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .caffe.PoolingParameter.PoolMethod pool = 1 [default = MAX];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::PoolingParameter_PoolMethod_IsValid(value)) {
            set_pool(static_cast< ::caffe::PoolingParameter_PoolMethod >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 kernel_size = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_kernel_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &kernel_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 stride = 3 [default = 1];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_stride();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &stride_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 pad = 4 [default = 0];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_pad();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pad_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 kernel_h = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_kernel_h();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &kernel_h_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 kernel_w = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_kernel_w();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &kernel_w_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 stride_h = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_stride_h();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &stride_h_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 stride_w = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {
          set_has_stride_w();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &stride_w_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 pad_h = 9 [default = 0];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          set_has_pad_h();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pad_h_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 pad_w = 10 [default = 0];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_pad_w();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pad_w_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PoolingParameter.Engine engine = 11 [default = DEFAULT];
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::PoolingParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::PoolingParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(11, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool global_pooling = 12 [default = false];
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {
          set_has_global_pooling();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &global_pooling_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.PoolingParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.PoolingParameter)
  return false;
#undef DO_
}